

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool roaring_iterate64(roaring_bitmap_t *r,roaring_iterator64 iterator,uint64_t high_bits,void *ptr
                       )

{
  uint8_t uVar1;
  _Bool _Var2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  int *piVar8;
  ulong uVar9;
  uint uVar10;
  bool bVar11;
  
  if (0 < (r->high_low_container).size) {
    lVar3 = 0;
    do {
      piVar8 = (int *)(r->high_low_container).containers[lVar3];
      uVar1 = (r->high_low_container).typecodes[lVar3];
      if (uVar1 == '\x04') {
        uVar1 = (uint8_t)piVar8[2];
        if (uVar1 == '\x04') {
          __assert_fail("*type != SHARED_CONTAINER_TYPE",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1062,
                        "const container_t *container_unwrap_shared(const container_t *, uint8_t *)"
                       );
        }
        piVar8 = *(int **)piVar8;
      }
      uVar10 = (uint)(r->high_low_container).keys[lVar3] * 0x10000;
      if (uVar1 == '\x03') {
        if (0 < *piVar8) {
          lVar5 = 0;
          do {
            lVar6 = (ulong)*(ushort *)(*(long *)(piVar8 + 2) + 2 + lVar5 * 4) + 1;
            uVar7 = *(ushort *)(*(long *)(piVar8 + 2) + lVar5 * 4) + uVar10;
            do {
              _Var2 = (*iterator)(uVar7 | high_bits,ptr);
              if (!_Var2) {
                return false;
              }
              uVar7 = uVar7 + 1;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
            lVar5 = lVar5 + 1;
          } while (lVar5 < *piVar8);
        }
      }
      else if (uVar1 == '\x02') {
        if (0 < *piVar8) {
          lVar5 = 0;
          do {
            _Var2 = (*iterator)((*(ushort *)(*(long *)(piVar8 + 2) + lVar5 * 2) | uVar10) |
                                high_bits,ptr);
            if (!_Var2) {
              return false;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < *piVar8);
        }
      }
      else {
        if (uVar1 != '\x01') {
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                        ,0x1803,
                        "_Bool container_iterate64(const container_t *, uint8_t, uint32_t, roaring_iterator64, uint64_t, void *)"
                       );
        }
        uVar9 = 0;
        bVar11 = false;
        do {
          uVar4 = *(ulong *)(*(long *)(piVar8 + 2) + uVar9 * 8);
          while (uVar4 != 0) {
            lVar5 = 0;
            if (uVar4 != 0) {
              for (; (uVar4 >> lVar5 & 1) == 0; lVar5 = lVar5 + 1) {
              }
            }
            _Var2 = (*iterator)(((uint)lVar5 | uVar10) | high_bits,ptr);
            uVar4 = uVar4 & uVar4 - 1;
            if (!_Var2) {
              if (!bVar11) {
                return false;
              }
              goto LAB_00119b35;
            }
          }
          uVar10 = uVar10 + 0x40;
          bVar11 = 0x3fe < uVar9;
          uVar9 = uVar9 + 1;
        } while (uVar9 != 0x400);
      }
LAB_00119b35:
      lVar3 = lVar3 + 1;
    } while (lVar3 < (r->high_low_container).size);
  }
  return true;
}

Assistant:

bool roaring_iterate64(const roaring_bitmap_t *r, roaring_iterator64 iterator,
                       uint64_t high_bits, void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate64(
                ra->containers[i], ra->typecodes[i],
                ((uint32_t)ra->keys[i]) << 16, iterator,
                high_bits, ptr)) {
            return false;
        }
    return true;
}